

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

ActionResultHolder<int> *
testing::internal::ActionResultHolder<int>::PerformAction<int(int,int,int)>
          (Action<int_(int,_int,_int)> *action,ArgumentTuple *args)

{
  ArgumentTuple *this;
  Result value;
  ActionResultHolder<int> *this_00;
  tuple<int,_int,_int> local_28;
  Wrapper local_1c;
  tuple<int,_int,_int> *local_18;
  ArgumentTuple *args_local;
  Action<int_(int,_int,_int)> *action_local;
  
  local_18 = args;
  args_local = (ArgumentTuple *)action;
  this_00 = (ActionResultHolder<int> *)operator_new(0x10);
  this = args_local;
  std::tuple<int,_int,_int>::tuple(&local_28,local_18);
  value = Action<int_(int,_int,_int)>::Perform((Action<int_(int,_int,_int)> *)this,&local_28);
  ReferenceOrValueWrapper<int>::ReferenceOrValueWrapper(&local_1c,value);
  ActionResultHolder(this_00,local_1c);
  return this_00;
}

Assistant:

static ActionResultHolder* PerformAction(
      const Action<F>& action, typename Function<F>::ArgumentTuple&& args) {
    return new ActionResultHolder(
        Wrapper(action.Perform(std::move(args))));
  }